

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

int __thiscall Bstrlib::CBString::operator_cast_to_int(CBString *this)

{
  int iVar1;
  CBStringException *this_00;
  allocator local_61;
  string local_60;
  undefined1 local_40 [8];
  CBStringException bstr__cppwrapper_exception;
  int d;
  CBString *this_local;
  
  bstr__cppwrapper_exception.msg.field_2._12_4_ = 0;
  iVar1 = __isoc99_sscanf((this->super_tagbstring).data,"%d",
                          (undefined1 *)((long)&bstr__cppwrapper_exception.msg.field_2 + 0xc));
  if (iVar1 != 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_60,"CBString::Unable to convert to an int",&local_61);
    CBStringException::CBStringException((CBStringException *)local_40,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(this_00,(CBStringException *)local_40);
    __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  return bstr__cppwrapper_exception.msg.field_2._12_4_;
}

Assistant:

CBString::operator int () const {
int d = 0;
	if (1 != sscanf ((const char *)this->data, "%d", &d)) {
		bstringThrow ("Unable to convert to an int");
	}
	return d;
}